

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

Result __thiscall
wabt::MemoryStream::MoveDataImpl(MemoryStream *this,size_t dst_offset,size_t src_offset,size_t size)

{
  pointer pOVar1;
  size_type sVar2;
  reference __dest;
  reference __src;
  ulong local_68;
  uint8_t *src;
  uint8_t *dst;
  size_t end;
  size_t dst_end;
  size_t src_end;
  size_t size_local;
  size_t src_offset_local;
  size_t dst_offset_local;
  MemoryStream *this_local;
  
  if (size == 0) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    local_68 = dst_offset + size;
    if (local_68 < src_offset + size) {
      local_68 = src_offset + size;
    }
    pOVar1 = std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::
             operator->(&this->buf_);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pOVar1->data);
    if (sVar2 < local_68) {
      pOVar1 = std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::
               operator->(&this->buf_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&pOVar1->data,local_68);
    }
    pOVar1 = std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::
             operator->(&this->buf_);
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&pOVar1->data,dst_offset);
    pOVar1 = std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::
             operator->(&this->buf_);
    __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      (&pOVar1->data,src_offset);
    memmove(__dest,__src,size);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result MemoryStream::MoveDataImpl(size_t dst_offset,
                                  size_t src_offset,
                                  size_t size) {
  if (size == 0) {
    return Result::Ok;
  }
  size_t src_end = src_offset + size;
  size_t dst_end = dst_offset + size;
  size_t end = src_end > dst_end ? src_end : dst_end;
  if (end > buf_->data.size()) {
    buf_->data.resize(end);
  }

  uint8_t* dst = &buf_->data[dst_offset];
  uint8_t* src = &buf_->data[src_offset];
  memmove(dst, src, size);
  return Result::Ok;
}